

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int JS_DefinePropertyValue(JSContext *ctx,JSValue this_obj,JSAtom prop,JSValue val,int flags)

{
  JSValue v;
  int iVar1;
  int ret;
  JSAtom in_stack_0000017c;
  JSContext *in_stack_00000180;
  undefined1 in_stack_00000188 [16];
  undefined1 in_stack_00000198 [16];
  JSValue in_stack_000002b0;
  JSValue in_stack_000002c0;
  int in_stack_000002d0;
  JSContext *ctx_00;
  JSValueUnion JVar2;
  int64_t iVar3;
  undefined4 uStack_54;
  
  ctx_00 = (JSContext *)0x3;
  JVar2.ptr = (void *)((ulong)uStack_54 << 0x20);
  iVar3 = 3;
  iVar1 = JS_DefineProperty(in_stack_00000180,(JSValue)in_stack_00000198,in_stack_0000017c,
                            (JSValue)in_stack_00000188,in_stack_000002b0,in_stack_000002c0,
                            in_stack_000002d0);
  v.tag = iVar3;
  v.u.ptr = JVar2.ptr;
  JS_FreeValue(ctx_00,v);
  return iVar1;
}

Assistant:

int JS_DefinePropertyValue(JSContext *ctx, JSValueConst this_obj,
                           JSAtom prop, JSValue val, int flags)
{
    int ret;
    ret = JS_DefineProperty(ctx, this_obj, prop, val, JS_UNDEFINED, JS_UNDEFINED,
                            flags | JS_PROP_HAS_VALUE | JS_PROP_HAS_CONFIGURABLE | JS_PROP_HAS_WRITABLE | JS_PROP_HAS_ENUMERABLE);
    JS_FreeValue(ctx, val);
    return ret;
}